

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

Var Js::JavascriptExceptionOperators::StackTraceAccessor
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  CallInfo bs;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint32 byteCodeOffset;
  HRESULT HVar5;
  BOOL BVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptLibrary *pJVar9;
  RecyclableObject *pRVar10;
  FunctionBody *pFVar11;
  HostScriptContext *pHVar12;
  Utf8SourceInfo *this;
  LPCWSTR functionName_00;
  ThreadContext *pTVar13;
  LPCWSTR local_230;
  bool local_1b1;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  void *__frameAddr;
  LPCWSTR functionName;
  LONG characterPosition;
  ULONG lineNumber;
  LPCWSTR pUrl;
  FunctionBody *pFStack_b8;
  bool isLibraryCode;
  FunctionBody *functionBody;
  ScriptContext *funcScriptContext;
  StackFrame *currentFrame;
  CallInfo CStack_98;
  int i;
  CompoundString *stringBuilder;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_88;
  StackTrace *stackTrace;
  AutoNestedHandledExceptionType local_70 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  JavascriptString *stringMessage;
  Var cache;
  RecyclableObject *obj;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  iVar3 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60e,"(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                       "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x60f,"(args.Info.Count > 0)","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  obj = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  if ((ScriptContext *)obj == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x613,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::RecyclableObject>(pvVar8);
  if (bVar2) {
    pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
    pRVar10 = VarTo<Js::RecyclableObject>(pvVar8);
    cache = pRVar10;
    if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
      stringMessage = (JavascriptString *)0x0;
      iVar3 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x14])(pRVar10,pRVar10,6,&stringMessage,0,obj);
      if ((iVar3 == 0) || (stringMessage == (JavascriptString *)0x0)) {
        pJVar9 = ScriptContext::GetLibrary((ScriptContext *)obj);
        ___autoNestedHandledExceptionType = (CallInfo)JavascriptLibrary::GetEmptyString(pJVar9);
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_70,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                            ExceptionType_OutOfMemory);
        local_88 = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)0x0;
        iVar3 = (**(code **)(*cache + 0xa0))(cache,cache,5,&local_88,0,obj);
        if ((iVar3 == 0) ||
           (local_88 ==
            (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)0x0)) {
          (**(code **)(*cache + 200))(cache,6,___autoNestedHandledExceptionType,0,0);
          callInfo_local = ___autoNestedHandledExceptionType;
          stringBuilder._4_4_ = 1;
        }
        else {
          bVar2 = IsErrorInstance(cache);
          if (bVar2) {
            ___autoNestedHandledExceptionType =
                 (CallInfo)JavascriptConversion::ToString(cache,(ScriptContext *)obj);
          }
          pJVar9 = ScriptContext::GetLibrary((ScriptContext *)obj);
          CStack_98 = (CallInfo)CompoundString::NewWithCharCapacity(0x28,pJVar9);
          CompoundString::AppendChars
                    ((CompoundString *)CStack_98,
                     (JavascriptString *)___autoNestedHandledExceptionType);
          for (currentFrame._4_4_ = 0; iVar3 = currentFrame._4_4_,
              iVar4 = JsUtil::
                      ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                      ::Count(&local_88->
                               super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                             ), iVar3 < iVar4; currentFrame._4_4_ = currentFrame._4_4_ + 1) {
            funcScriptContext =
                 (ScriptContext *)
                 JsUtil::
                 List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(local_88,currentFrame._4_4_);
            bVar2 = JavascriptExceptionContext::StackFrame::IsScriptFunction
                              ((StackFrame *)funcScriptContext);
            if (bVar2) {
              pFVar11 = JavascriptExceptionContext::StackFrame::GetFunctionBody
                                  ((StackFrame *)funcScriptContext);
              functionBody = (FunctionBody *)
                             FunctionProxy::GetScriptContext((FunctionProxy *)pFVar11);
              if ((ScriptContext *)functionBody == (ScriptContext *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                                   ,0x64e,"(funcScriptContext)","funcScriptContext");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar7 = 0;
              }
              if ((FunctionBody *)obj == functionBody) goto LAB_00f7ef8d;
              pHVar12 = ScriptContext::GetHostScriptContext((ScriptContext *)obj);
              iVar3 = (*pHVar12->_vptr_HostScriptContext[8])(pHVar12,functionBody);
              if (-1 < iVar3) goto LAB_00f7ef8d;
            }
            else {
LAB_00f7ef8d:
              pFStack_b8 = JavascriptExceptionContext::StackFrame::GetFunctionBody
                                     ((StackFrame *)funcScriptContext);
              local_1b1 = true;
              if (pFStack_b8 != (FunctionBody *)0x0) {
                this = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFStack_b8);
                local_1b1 = Utf8SourceInfo::GetIsLibraryCode(this);
              }
              bs = CStack_98;
              pFVar11 = pFStack_b8;
              pUrl._7_1_ = local_1b1;
              if (local_1b1 == false) {
                _characterPosition = (LPCWSTR)0x0;
                functionName._4_4_ = 0;
                functionName._0_4_ = 0;
                byteCodeOffset =
                     JavascriptExceptionContext::StackFrame::GetByteCodeOffset
                               ((StackFrame *)funcScriptContext);
                FunctionBody::GetLineCharOffset
                          (pFVar11,byteCodeOffset,(ULONG *)((long)&functionName + 4),
                           (LONG *)&functionName,true);
                _characterPosition =
                     ParseableFunctionInfo::GetSourceName(&pFStack_b8->super_ParseableFunctionInfo);
                __frameAddr = (void *)0x0;
                if ((DAT_01ec73d5 & 1) == 0) {
                  __frameAddr = ParseableFunctionInfo::GetExternalDisplayName
                                          (&pFStack_b8->super_ParseableFunctionInfo);
                }
                else {
                  LeaveScriptObject<true,_false,_false>::LeaveScriptObject
                            ((LeaveScriptObject<true,_false,_false> *)
                             &autoReentrancyHandler.m_savedReentrancySafeOrHandled,
                             (ScriptContext *)obj,&stack0xfffffffffffffff8);
                  pTVar13 = ScriptContext::GetThreadContext((ScriptContext *)obj);
                  AutoReentrancyHandler::AutoReentrancyHandler
                            ((AutoReentrancyHandler *)&err,pTVar13);
                  HVar5 = JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments
                                    ((StackFrame *)funcScriptContext,(LPCWSTR *)&__frameAddr);
                  if (HVar5 != 0) {
                    __frameAddr = ParseableFunctionInfo::GetExternalDisplayName
                                            (&pFStack_b8->super_ParseableFunctionInfo);
                  }
                  if (obj != (RecyclableObject *)0x0) {
                    pTVar13 = ScriptContext::GetThreadContext((ScriptContext *)obj);
                    ThreadContext::DisposeOnLeaveScript(pTVar13);
                  }
                  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)&err);
                  LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
                            ((LeaveScriptObject<true,_false,_false> *)
                             &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
                }
                if (_characterPosition == (LPCWSTR)0x0) {
                  local_230 = L"";
                }
                else {
                  local_230 = _characterPosition;
                }
                AppendExternalFrameToStackTrace
                          ((CompoundString *)CStack_98,(LPCWSTR)__frameAddr,local_230,
                           functionName._4_4_ + 1,(int)functionName + 1);
              }
              else {
                functionName_00 =
                     JavascriptExceptionContext::StackFrame::GetFunctionName
                               ((StackFrame *)funcScriptContext);
                AppendLibraryFrameToStackTrace((CompoundString *)bs,functionName_00);
              }
            }
          }
          ___autoNestedHandledExceptionType = CStack_98;
          BVar6 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                               ,0x67c,
                               "(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                               "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          stringBuilder._4_4_ = 0;
        }
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_70);
        if (stringBuilder._4_4_ == 0) {
          (**(code **)(*cache + 200))(cache,6,___autoNestedHandledExceptionType,0,0);
          callInfo_local = ___autoNestedHandledExceptionType;
        }
      }
      else {
        callInfo_local = (CallInfo)stringMessage;
      }
    }
    else {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
      (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x19])(pRVar10,6,pvVar8,0,0);
      bVar2 = VarIs<Js::JavascriptError,Js::RecyclableObject>((RecyclableObject *)cache);
      if (bVar2) {
        JavascriptError::SetStackPropertyRedefined((JavascriptError *)cache,true);
      }
      pJVar9 = ScriptContext::GetLibrary((ScriptContext *)obj);
      callInfo_local = (CallInfo)JavascriptLibrary::GetEmptyString(pJVar9);
    }
  }
  else {
    pJVar9 = ScriptContext::GetLibrary((ScriptContext *)obj);
    callInfo_local =
         (CallInfo)JavascriptLibraryBase::GetUndefined(&pJVar9->super_JavascriptLibraryBase);
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptExceptionOperators::StackTraceAccessor(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        ScriptContext *scriptContext = function->GetScriptContext();

        AnalysisAssert(scriptContext);

        // If the first argument to the accessor is not a recyclable object, return undefined
        // for compat with other browsers
        if (!VarIs<RecyclableObject>(args[0]))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        RecyclableObject *obj = VarTo<RecyclableObject>(args[0]);

        // If an argument was passed to the accessor, it is being called as a setter.
        // Set the internal StackTraceCache property accordingly.
        if (args.Info.Count > 1)
        {
            obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, args[1], PropertyOperationFlags::PropertyOperation_None, NULL);
            if (VarIs<JavascriptError>(obj))
            {
                ((JavascriptError *)obj)->SetStackPropertyRedefined(true);
            }
            return scriptContext->GetLibrary()->GetEmptyString();
        }

        // Otherwise, the accessor is being called as a getter.
        // Return existing cached value, or obtain the string representation of the StackTrace to return.
        Var cache = NULL;
        if (obj->GetInternalProperty(obj,InternalPropertyIds::StackTraceCache, (Var*)&cache, NULL, scriptContext) && cache)
        {
            return cache;
        }

        JavascriptString* stringMessage = scriptContext->GetLibrary()->GetEmptyString();
        HRESULT hr;
        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
        {
            Js::JavascriptExceptionContext::StackTrace *stackTrace = NULL;
            if (!obj->GetInternalProperty(obj,InternalPropertyIds::StackTrace, (Js::Var*) &stackTrace, NULL, scriptContext) ||
                stackTrace == nullptr)
            {
                obj->SetInternalProperty(InternalPropertyIds::StackTraceCache, stringMessage, PropertyOperationFlags::PropertyOperation_None, NULL);
                return stringMessage;
            }

            if (IsErrorInstance(obj))
            {
                stringMessage = JavascriptConversion::ToString(obj, scriptContext);
            }

            CompoundString *const stringBuilder = CompoundString::NewWithCharCapacity(40, scriptContext->GetLibrary());
            stringBuilder->AppendChars(stringMessage);

            for (int i = 0; i < stackTrace->Count(); i++)
            {
                Js::JavascriptExceptionContext::StackFrame& currentFrame = stackTrace->Item(i);

                // Defend in depth. Discard cross domain frames if somehow they creped in.
                if (currentFrame.IsScriptFunction())
                {
                    ScriptContext* funcScriptContext = currentFrame.GetFunctionBody()->GetScriptContext();
                    AnalysisAssert(funcScriptContext);
                    if (scriptContext != funcScriptContext && FAILED(scriptContext->GetHostScriptContext()->CheckCrossDomainScriptContext(funcScriptContext)))
                    {
                        continue; // Ignore this frame
                    }
                }

                FunctionBody* functionBody = currentFrame.GetFunctionBody();
                const bool isLibraryCode = !functionBody || functionBody->GetUtf8SourceInfo()->GetIsLibraryCode();
                if (isLibraryCode)
                {
                    AppendLibraryFrameToStackTrace(stringBuilder, currentFrame.GetFunctionName());
                }
                else
                {
                    LPCWSTR pUrl = NULL;
                    ULONG lineNumber = 0;
                    LONG characterPosition = 0;

                    functionBody->GetLineCharOffset(currentFrame.GetByteCodeOffset(), &lineNumber, &characterPosition);
                    pUrl = functionBody->GetSourceName();
                    LPCWSTR functionName = nullptr;
                    if (CONFIG_FLAG(ExtendedErrorStackForTestHost))
                    {
                        BEGIN_LEAVE_SCRIPT_INTERNAL(scriptContext)
                        {
                            if (currentFrame.GetFunctionNameWithArguments(&functionName) != S_OK)
                            {
                                functionName = functionBody->GetExternalDisplayName();
                            }
                        }
                        END_LEAVE_SCRIPT_INTERNAL(scriptContext)
                    }
                    else
                    {
                        functionName = functionBody->GetExternalDisplayName();
                    }
                    AppendExternalFrameToStackTrace(stringBuilder, functionName, pUrl ? pUrl : _u(""), lineNumber + 1, characterPosition + 1);
                }
            }

            // Try to create the string object even if we did OOM, but if can't, just return what we've got. We catch and ignore OOM so it doesn't propagate up.
            // With all the stack trace functionality, we do best effort to produce the stack trace in the case of OOM, but don't want it to trigger an OOM. Idea is if do take
            // an OOM, have some chance of producing a stack trace to see where it happened.
            stringMessage = stringBuilder;
        }